

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

void __thiscall md::Code::resolve_branches(Code *this)

{
  _Rb_tree_node_base *__args;
  pointer puVar1;
  _Rb_tree_color _Var2;
  pointer puVar3;
  size_type sVar4;
  mapped_type_conflict1 *pmVar5;
  _Base_ptr p_Var6;
  LandstalkerException *this_00;
  int iVar7;
  pointer puVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> branches_to_clean;
  uint32_t addr;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  branches_to_clean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  branches_to_clean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  branches_to_clean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = (this->_pending_branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    puVar3 = branches_to_clean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((_Rb_tree_header *)p_Var6 == &(this->_pending_branches)._M_t._M_impl.super__Rb_tree_header)
    {
      for (puVar8 = branches_to_clean.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1) {
        addr = *puVar8;
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase(&(this->_pending_branches)._M_t,&addr);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&branches_to_clean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
      ;
      return;
    }
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::count(&this->_labels,(key_type *)&p_Var6[1]._M_parent);
    if (sVar4 != 0) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&this->_labels,(key_type *)&p_Var6[1]._M_parent);
      __args = p_Var6 + 1;
      _Var2 = __args->_M_color;
      iVar7 = *pmVar5 - _Var2;
      if (iVar7 - 0x8000U < 0xffff0001) {
        this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string(&local_70,__args->_M_color);
        std::operator+(&local_50,"Offset for branch at byte ",&local_70);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                       &local_50," is too big (cannot be expressed as word)");
        LandstalkerException::LandstalkerException(this_00,(string *)&addr);
        __cxa_throw(this_00,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      if (iVar7 - 0x80U < 0xffffff01) {
        addr = CONCAT31(addr._1_3_,(char)((uint)iVar7 >> 8));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_insert_rval
                  (&this->_bytes,
                   (const_iterator)
                   ((this->_bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start + _Var2),(value_type_conflict *)&addr)
        ;
        addr = CONCAT31(addr._1_3_,(char)iVar7);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_insert_rval
                  (&this->_bytes,
                   (const_iterator)
                   ((this->_bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start + (ulong)__args->_M_color + 1),
                   (value_type_conflict *)&addr);
      }
      else {
        puVar1 = (this->_bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((ulong)_Var2 - 1);
        *puVar1 = *puVar1 + (char)iVar7;
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&branches_to_clean,
                 &__args->_M_color);
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

void Code::resolve_branches()
{
    std::vector<uint32_t> branches_to_clean;

    for (auto& [branch_address, label] : _pending_branches)
    {
        if (_labels.count(label))
        {
            uint32_t label_address = _labels[label];
            int32_t offset = (int32_t)(label_address - branch_address);
            if(offset > 0x7FFF || offset < -0x7FFF)
            {
                throw LandstalkerException("Offset for branch at byte " + std::to_string(branch_address) +
                                           " is too big (cannot be expressed as word)");
            }

            int16_t truncated_offset = (int16_t)(label_address - branch_address);
            uint16_t truncated_offset_as_word = static_cast<uint16_t>(truncated_offset);
            if (truncated_offset > 0x7F || truncated_offset < -0x7F)
            {
                // Branch offset is more than one byte long, we need to add an optional displacement
                _bytes.insert(_bytes.begin() + branch_address, static_cast<uint8_t>(truncated_offset_as_word >> 8));
                _bytes.insert(_bytes.begin() + branch_address + 1, static_cast<uint8_t>(truncated_offset_as_word & 0x00FF));
            }
            else
            {
                // Branch offset is less than one byte long, we only need to increment opcode by the offset value
                _bytes[static_cast<size_t>(branch_address) - 1] += truncated_offset_as_word;
            }

            branches_to_clean.emplace_back(branch_address);
        }
    }

    for (uint32_t addr : branches_to_clean)
        _pending_branches.erase(addr);
}